

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  int iVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  type_conflict5 tVar4;
  DataKey DVar5;
  DataKey *pDVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  uint *puVar10;
  uint *puVar11;
  byte bVar12;
  SPxId enterId;
  SPxId enterIdCo;
  double local_1a0;
  cpp_dec_float<200U,_int,_void> local_198;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  enterIdCo.super_DataKey.info = 0;
  enterIdCo.super_DataKey.idx = -1;
  local_198.data._M_elems[0] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[0];
  puVar10 = (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 1;
  puVar11 = local_118.m_backend.data._M_elems;
  lVar8 = 0x1b;
  puVar9 = puVar10;
  for (lVar7 = lVar8; puVar11 = (uint *)((long)puVar11 + 4), lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar11 = *puVar9;
    puVar9 = puVar9 + 1;
  }
  iVar1 = (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.exp;
  fVar2 = (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.fpclass;
  iVar3 = (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.prec_elem;
  bVar12 = (local_198.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite) ^
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.neg;
  puVar11 = local_198.data._M_elems;
  local_118.m_backend.data._M_elems[0] = local_198.data._M_elems[0];
  local_118.m_backend.exp = iVar1;
  local_118.m_backend.neg = (bool)bVar12;
  local_118.m_backend.fpclass = fVar2;
  local_118.m_backend.prec_elem = iVar3;
  for (; puVar11 = puVar11 + 1, lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar11 = *puVar10;
    puVar10 = puVar10 + 1;
  }
  local_198.exp = iVar1;
  local_198.neg = (bool)bVar12;
  local_198.fpclass = fVar2;
  local_198.prec_elem = iVar3;
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnter == true) {
    enterId = selectEnterSparseDim(this,&local_118,&enterId);
  }
  else {
    enterId = selectEnterDenseDim(this,&local_118,&enterId);
  }
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnterCo == true) {
    DVar5 = (DataKey)selectEnterSparseCoDim
                               (this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_198,&enterId);
  }
  else {
    DVar5 = (DataKey)selectEnterDenseCoDim
                               (this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_198,&enterId);
  }
  enterIdCo.super_DataKey = DVar5;
  if (enterId.super_DataKey.info != 0) {
    local_1a0 = 0.8;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&result.m_backend,&local_198,&local_1a0);
    tVar4 = boost::multiprecision::operator>
                      (&local_118,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result.m_backend);
    if ((tVar4) || (DVar5.info == 0)) {
      pDVar6 = &enterId.super_DataKey;
      goto LAB_004439bd;
    }
  }
  pDVar6 = &enterIdCo.super_DataKey;
LAB_004439bd:
  return (SPxId)*pDVar6;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterX()
{
   SPxId enterId;
   SPxId enterIdCo;
   R best;
   R bestCo;

   best = -this->thetolerance;
   bestCo = -this->thetolerance;
   enterId = (this->thesolver->sparsePricingEnter) ? selectEnterSparseDim(best,
             enterId) : selectEnterDenseDim(best, enterId);
   enterIdCo = (this->thesolver->sparsePricingEnterCo) ? selectEnterSparseCoDim(bestCo,
               enterId) : selectEnterDenseCoDim(bestCo, enterId);

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterIdCo.isValid()))
      return enterId;
   else
      return enterIdCo;
}